

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::PackedSlice::set_up(PackedSlice *this,PackedStruct *struct_,string *member_name)

{
  bool bVar1;
  bool bVar2;
  __type_conflict2 _Var3;
  int iVar4;
  uint32_t uVar5;
  InternalException *this_00;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  string local_f8;
  PackedStructFieldDef *local_d8;
  PackedStructFieldDef *def;
  const_iterator __end1;
  const_iterator __begin1;
  vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_> *__range1;
  bool found;
  uint32_t low_;
  string *member_name_local;
  PackedStruct *struct__local;
  PackedSlice *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  
  __range1._4_4_ = 0;
  bVar1 = false;
  __end1 = std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ::begin(&struct_->attributes);
  def = (PackedStructFieldDef *)
        std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>::
        end(&struct_->attributes);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
                                *)&def);
    if (!bVar2) {
LAB_0021f982:
      if (bVar1) {
        return;
      }
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_38 = &local_f8;
      local_40 = "{0} does not exist in {1}";
      vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)struct_;
      local_48 = member_name;
      fmt::v7::
      make_args_checked<std::__cxx11::string_const&,std::__cxx11::string_const&,char[26],char>
                (&local_78,(v7 *)"{0} does not exist in {1}",(char (*) [26])member_name,
                 &struct_->struct_name,in_R8);
      local_58 = &local_78;
      local_88 = fmt::v7::to_string_view<char,_0>(local_40);
      local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)&this_local;
      local_30 = local_58;
      local_20 = local_58;
      local_10 = local_58;
      local_18 = local_28;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_28,0xdd,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_58);
      format_str.size_ = (size_t)this_local;
      format_str.data_ = (char *)local_88.size_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_90.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_f8,(detail *)local_88.data_,format_str,args);
      InternalException::InternalException(this_00,&local_f8);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_d8 = __gnu_cxx::
               __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
               ::operator*(&__end1);
    _Var3 = std::operator==(&local_d8->name,member_name);
    if (_Var3) {
      bVar1 = true;
      uVar5 = PackedStructFieldDef::bitwidth(local_d8);
      (this->super_VarSlice).high = (uVar5 + __range1._4_4_) - 1;
      (this->super_VarSlice).low = __range1._4_4_;
      (this->super_VarSlice).super_Var.is_signed_ = (bool)(local_d8->signed_ & 1);
      uVar5 = (this->super_VarSlice).high;
      iVar4 = (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
      (this->super_VarSlice).var_high_ = uVar5 + iVar4;
      uVar5 = (this->super_VarSlice).low;
      iVar4 = (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
      (this->super_VarSlice).var_low_ = uVar5 + iVar4;
      (this->super_VarSlice).super_Var.var_width_ =
           ((this->super_VarSlice).var_high_ - (this->super_VarSlice).var_low_) + 1;
      this->def_ = local_d8;
      goto LAB_0021f982;
    }
    uVar5 = PackedStructFieldDef::bitwidth(local_d8);
    __range1._4_4_ = uVar5 + __range1._4_4_;
    __gnu_cxx::
    __normal_iterator<const_kratos::PackedStructFieldDef_*,_std::vector<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void PackedSlice::set_up(const kratos::PackedStruct &struct_, const std::string &member_name) {
    // compute the high and low
    uint32_t low_ = 0;
    bool found = false;
    for (auto const &def : struct_.attributes) {
        if (def.name == member_name) {
            found = true;
            high = def.bitwidth() + low_ - 1;
            low = low_;
            is_signed_ = def.signed_;
            var_high_ = high + parent_var->var_low();
            var_low_ = low + parent_var->var_low();
            var_width_ = var_high_ - var_low_ + 1;
            def_ = &def;
            break;
        } else {
            low_ += def.bitwidth();
        }
    }

    if (!found) {
        throw InternalException(
            ::format("{0} does not exist in {1}", member_name, struct_.struct_name));
    }
}